

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

string * __thiscall
GeneratorExpressionContent::Evaluate_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer ppcVar1;
  int iVar2;
  cmGeneratorExpressionNode *node;
  pointer ppcVar3;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string identifier;
  string local_f8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  ppcVar3 = (this->IdentifierChildren).
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->IdentifierChildren).
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar3 == ppcVar1) {
      node = cmGeneratorExpressionNode::GetNode(&local_b0);
      if (node == (cmGeneratorExpressionNode *)0x0) {
        GetOriginalExpression_abi_cxx11_(&local_f8,this);
        std::__cxx11::string::string
                  ((string *)&local_d0,"Expression did not evaluate to a known generator expression"
                   ,(allocator *)&local_90);
        reportError(context,&local_f8,&local_d0);
        this_00 = &local_d0;
      }
      else {
        iVar2 = (*node->_vptr_cmGeneratorExpressionNode[2])(node);
        if ((char)iVar2 != '\0') {
          local_f8._M_dataplus._M_p = (pointer)0x0;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_allocated_capacity = 0;
          EvaluateParameters(&local_70,this,node,&local_b0,context,dagChecker,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_f8);
          std::__cxx11::string::~string((string *)&local_70);
          if (context->HadError == true) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            (*node->_vptr_cmGeneratorExpressionNode[6])
                      (__return_storage_ptr__,node,&local_f8,context,this,dagChecker);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_f8);
          goto LAB_004b937f;
        }
        iVar2 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
        if ((iVar2 != 1) ||
           (iVar2 = (*node->_vptr_cmGeneratorExpressionNode[4])(node), (char)iVar2 == '\0')) {
          local_f8._M_dataplus._M_p = (pointer)0x0;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_allocated_capacity = 0;
          EvaluateParameters(&local_50,this,node,&local_b0,context,dagChecker,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_f8);
          std::__cxx11::string::~string((string *)&local_50);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_f8);
          break;
        }
        if ((this->ParamChildren).
            super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->ParamChildren).
            super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        GetOriginalExpression_abi_cxx11_(&local_f8,this);
        std::operator+(&local_90,"$<",&local_b0);
        std::operator+(&local_d0,&local_90,"> expression requires a parameter.");
        reportError(context,&local_f8,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        this_00 = &local_90;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)&local_f8);
      break;
    }
    (*(*ppcVar3)->_vptr_cmGeneratorExpressionEvaluator[3])(&local_f8,*ppcVar3,context,dagChecker);
    std::__cxx11::string::append((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f8);
    ppcVar3 = ppcVar3 + 1;
  } while (context->HadError != true);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_004b937f:
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorExpressionContent::Evaluate(
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker) const
{
  std::string identifier;
  {
    std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it =
      this->IdentifierChildren.begin();
    const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end =
      this->IdentifierChildren.end();
    for (; it != end; ++it) {
      identifier += (*it)->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
  }

  const cmGeneratorExpressionNode* node =
    cmGeneratorExpressionNode::GetNode(identifier);

  if (!node) {
    reportError(context, this->GetOriginalExpression(),
                "Expression did not evaluate to a known generator expression");
    return std::string();
  }

  if (!node->GeneratesContent()) {
    if (node->NumExpectedParameters() == 1 &&
        node->AcceptsArbitraryContentParameter()) {
      if (this->ParamChildren.empty()) {
        reportError(context, this->GetOriginalExpression(),
                    "$<" + identifier + "> expression requires a parameter.");
      }
    } else {
      std::vector<std::string> parameters;
      this->EvaluateParameters(node, identifier, context, dagChecker,
                               parameters);
    }
    return std::string();
  }

  std::vector<std::string> parameters;
  this->EvaluateParameters(node, identifier, context, dagChecker, parameters);
  if (context->HadError) {
    return std::string();
  }

  return node->Evaluate(parameters, context, this, dagChecker);
}